

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCastHugeDecimalToNumeric<short>
               (hugeint_t input,short *result,CastParameters *parameters,uint8_t scale)

{
  hugeint_t input_00;
  hugeint_t input_01;
  bool bVar1;
  byte in_R8B;
  string error;
  hugeint_t scaled_value;
  hugeint_t rounding;
  hugeint_t power;
  CastParameters *in_stack_fffffffffffffeb8;
  hugeint_t *in_stack_fffffffffffffec0;
  string *error_message;
  int64_t in_stack_fffffffffffffec8;
  undefined1 strict;
  hugeint_t *in_stack_fffffffffffffed0;
  hugeint_t *in_stack_fffffffffffffed8;
  hugeint_t *in_stack_fffffffffffffee0;
  _Alloc_hider in_stack_ffffffffffffff0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  string asStack_d0 [32];
  uint64_t uStack_b0;
  int64_t iStack_a8;
  hugeint_t hStack_a0;
  hugeint_t hStack_90;
  hugeint_t hStack_60;
  hugeint_t hStack_50;
  uint64_t uStack_40;
  int64_t iStack_38;
  byte bStack_1;
  
  uStack_40 = *(uint64_t *)(Hugeint::POWERS_OF_TEN + (ulong)in_R8B * 0x10);
  iStack_38 = *(int64_t *)(Hugeint::POWERS_OF_TEN + (ulong)in_R8B * 0x10 + 8);
  hugeint_t::hugeint_t(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  bVar1 = hugeint_t::operator<(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (bVar1) {
    hStack_60 = hugeint_t::operator-(in_stack_fffffffffffffec0);
  }
  else {
    hStack_60.upper = iStack_38;
    hStack_60.lower = uStack_40;
  }
  hugeint_t::hugeint_t(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  strict = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  hStack_50 = hugeint_t::operator/(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  hStack_a0 = hugeint_t::operator+(in_stack_fffffffffffffec0,(hugeint_t *)in_stack_fffffffffffffeb8)
  ;
  hStack_90 = hugeint_t::operator/(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  uStack_b0 = hStack_90.lower;
  iStack_a8 = hStack_90.upper;
  input_01.upper = (int64_t)in_stack_fffffffffffffee0;
  input_01.lower = (uint64_t)in_stack_fffffffffffffed8;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,_short>
                    (input_01,(int16_t *)in_stack_fffffffffffffed0,(bool)strict);
  if (bVar1) {
    bStack_1 = 1;
  }
  else {
    error_message = (string *)&stack0xffffffffffffff0f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff10,"Failed to cast decimal value %s to type %s",
               (allocator *)error_message);
    input_00.upper = (int64_t)in_stack_fffffffffffffed8;
    input_00.lower = hStack_90.upper;
    ConvertToString::Operation<duckdb::hugeint_t>(input_00);
    GetTypeId<short>();
    StringUtil::
    Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::PhysicalType>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (PhysicalType)in_stack_ffffffffffffff0f);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
    HandleCastError::AssignError(error_message,in_stack_fffffffffffffeb8);
    bStack_1 = 0;
    ::std::__cxx11::string::~string(asStack_d0);
  }
  return (bool)(bStack_1 & 1);
}

Assistant:

bool TryCastHugeDecimalToNumeric(hugeint_t input, DST &result, CastParameters &parameters, uint8_t scale) {
	const auto power = Hugeint::POWERS_OF_TEN[scale];
	const auto rounding = ((input < 0) ? -power : power) / 2;
	auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<hugeint_t, DST>(scaled_value, result)) {
		string error = StringUtil::Format("Failed to cast decimal value %s to type %s",
		                                  ConvertToString::Operation(scaled_value), GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}